

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_ComputeFastMerkleRootTest1_Test::TestBody
          (CryptoUtil_ComputeFastMerkleRootTest1_Test *this)

{
  allocator<cfd::core::ByteData256> *paVar1;
  initializer_list<cfd::core::ByteData256> __l;
  initializer_list<cfd::core::ByteData256> __l_00;
  pointer puVar2;
  bool bVar3;
  pointer puVar4;
  char *pcVar5;
  reference pvVar6;
  char *rhs;
  Message *pMVar7;
  ByteData256 *local_470;
  ByteData256 *local_408;
  AssertHelper local_3c0;
  Message local_3b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_398;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_1;
  ByteData256 root;
  Message local_350;
  string local_348;
  string local_328;
  undefined1 local_308 [8];
  AssertionResult gtest_ar;
  ByteData256 root_1;
  size_t i;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> leaves;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  ByteData256 *local_1f8;
  ByteData256 local_1f0;
  ByteData256 local_1d8;
  ByteData256 local_1c0;
  ByteData256 local_1a8;
  ByteData256 local_190;
  undefined1 local_178 [24];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> test_roots;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_c1;
  string local_c0;
  ByteData256 *local_a0;
  ByteData256 local_98;
  ByteData256 local_80;
  ByteData256 local_68;
  ByteData256 local_50;
  undefined1 local_38 [24];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> test_leaves;
  CryptoUtil_ComputeFastMerkleRootTest1_Test *this_local;
  
  test_roots.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_a0 = &local_98;
  test_leaves.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"0ff84a4fe52fd957900ef812a2c6dbd76f95371bf356aa055134e58ebf752c59",
             &local_c1);
  cfd::core::ByteData256::ByteData256(&local_98,&local_c0);
  local_a0 = &local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f8,"56aa859e86b5decd00dda32c9bc4de144337689d23f29ca3ed6e7b8fa311b0a5",
             &local_f9);
  cfd::core::ByteData256::ByteData256(&local_80,&local_f8);
  local_a0 = &local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,"7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5"
             ,&local_121);
  cfd::core::ByteData256::ByteData256(&local_68,&local_120);
  local_a0 = &local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"9695c03041bc01aea1d8af998f9fa3e529c98492acc883df4e2dc786c112123a"
             ,(allocator *)
              ((long)&test_roots.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256(&local_50,&local_148);
  test_roots.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_38._0_8_ = &local_98;
  local_38._8_8_ = (pointer)0x4;
  paVar1 = (allocator<cfd::core::ByteData256> *)
           ((long)&test_roots.
                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<cfd::core::ByteData256>::allocator(paVar1);
  __l_00._M_len = local_38._8_8_;
  __l_00._M_array = (iterator)local_38._0_8_;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_38 + 0x10),__l_00,paVar1);
  std::allocator<cfd::core::ByteData256>::~allocator
            ((allocator<cfd::core::ByteData256> *)
             ((long)&test_roots.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_408 = (ByteData256 *)local_38;
  do {
    local_408 = local_408 + -1;
    cfd::core::ByteData256::~ByteData256(local_408);
  } while (local_408 != &local_98);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&test_roots.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  leaves.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_1f8 = &local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_218,"0000000000000000000000000000000000000000000000000000000000000000"
             ,&local_219);
  cfd::core::ByteData256::ByteData256(&local_1f0,&local_218);
  local_1f8 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_240,"0ff84a4fe52fd957900ef812a2c6dbd76f95371bf356aa055134e58ebf752c59"
             ,&local_241);
  cfd::core::ByteData256::ByteData256(&local_1d8,&local_240);
  local_1f8 = &local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_268,"a763f33a89bc137a88e25eede516ffefc98fb98e95c00b9bdc70b12538fe9e2a"
             ,&local_269);
  cfd::core::ByteData256::ByteData256(&local_1c0,&local_268);
  local_1f8 = &local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_290,"e608818b7b3e1253e3de2f1f657392df21689dee5d5176205d4f28eb72801994"
             ,&local_291);
  cfd::core::ByteData256::ByteData256(&local_1a8,&local_290);
  local_1f8 = &local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2b8,"41ad854abd919bf323dc869b5826ecef841685bd44d9c7af23aa42900fb193af"
             ,(allocator *)
              ((long)&leaves.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256(&local_190,&local_2b8);
  leaves.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_178._0_8_ = &local_1f0;
  local_178._8_8_ = (pointer)0x5;
  paVar1 = (allocator<cfd::core::ByteData256> *)
           ((long)&leaves.
                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<cfd::core::ByteData256>::allocator(paVar1);
  __l._M_len = local_178._8_8_;
  __l._M_array = (iterator)local_178._0_8_;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_178 + 0x10),__l,paVar1);
  std::allocator<cfd::core::ByteData256>::~allocator
            ((allocator<cfd::core::ByteData256> *)
             ((long)&leaves.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_470 = (ByteData256 *)local_178;
  do {
    local_470 = local_470 + -1;
    cfd::core::ByteData256::~ByteData256(local_470);
  } while (local_470 != &local_1f0);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&leaves.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&i);
  for (root_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar2 = root_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
      puVar4 = (pointer)std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        ::size((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                *)(local_38 + 0x10)), puVar2 < puVar4;
      root_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           root_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) {
    cfd::core::CryptoUtil::ComputeFastMerkleRoot
              ((ByteData256 *)&gtest_ar.message_,
               (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&i);
    cfd::core::ByteData256::GetHex_abi_cxx11_(&local_328,(ByteData256 *)&gtest_ar.message_);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pvVar6 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
             operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        (local_178 + 0x10),
                        (size_type)
                        root_1.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    cfd::core::ByteData256::GetHex_abi_cxx11_(&local_348,pvVar6);
    rhs = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_308,"root.GetHex().c_str()","test_roots[i].GetHex().c_str()",pcVar5
               ,rhs);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_328);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
    if (!bVar3) {
      testing::Message::Message(&local_350);
      pMVar7 = testing::Message::operator<<(&local_350,(char (*) [8])"index: ");
      pMVar7 = testing::Message::operator<<
                         (pMVar7,(unsigned_long *)
                                 &root_1.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &root.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
                 ,0x2b0,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &root.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,pMVar7);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &root.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_350);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
    pvVar6 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
             operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        (local_38 + 0x10),
                        (size_type)
                        root_1.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&i,pvVar6)
    ;
    cfd::core::ByteData256::~ByteData256((ByteData256 *)&gtest_ar.message_);
  }
  cfd::core::CryptoUtil::ComputeFastMerkleRoot
            ((ByteData256 *)&gtest_ar_1.message_,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&i);
  cfd::core::ByteData256::GetBytes(&local_398,(ByteData256 *)&gtest_ar_1.message_);
  pvVar6 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::back
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      (local_178 + 0x10));
  cfd::core::ByteData256::GetBytes(&local_3b0,pvVar6);
  testing::internal::EqHelper<false>::
  Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((EqHelper<false> *)local_380,"root.GetBytes()","test_roots.back().GetBytes()",
             &local_398,&local_3b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_398);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar3) {
    testing::Message::Message(&local_3b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x2b4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)&gtest_ar_1.message_);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&i);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_178 + 0x10));
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_38 + 0x10));
  return;
}

Assistant:

TEST(CryptoUtil, ComputeFastMerkleRootTest1) {
  std::vector<ByteData256> test_leaves = {
    ByteData256("0ff84a4fe52fd957900ef812a2c6dbd76f95371bf356aa055134e58ebf752c59"),
    ByteData256("56aa859e86b5decd00dda32c9bc4de144337689d23f29ca3ed6e7b8fa311b0a5"),
    ByteData256("7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5"),
    ByteData256("9695c03041bc01aea1d8af998f9fa3e529c98492acc883df4e2dc786c112123a"),
  };
  std::vector<ByteData256> test_roots = {
    ByteData256("0000000000000000000000000000000000000000000000000000000000000000"),
    ByteData256("0ff84a4fe52fd957900ef812a2c6dbd76f95371bf356aa055134e58ebf752c59"),
    ByteData256("a763f33a89bc137a88e25eede516ffefc98fb98e95c00b9bdc70b12538fe9e2a"),
    ByteData256("e608818b7b3e1253e3de2f1f657392df21689dee5d5176205d4f28eb72801994"),
    ByteData256("41ad854abd919bf323dc869b5826ecef841685bd44d9c7af23aa42900fb193af"),
  };
  std::vector<ByteData256> leaves;
  
  for(size_t i = 0; i < test_leaves.size(); ++i) {
    ByteData256 root = CryptoUtil::ComputeFastMerkleRoot(leaves);
    EXPECT_STREQ(root.GetHex().c_str(), test_roots[i].GetHex().c_str()) << "index: " << i;
    leaves.push_back(test_leaves[i]);
  }
  ByteData256 root = CryptoUtil::ComputeFastMerkleRoot(leaves);
  EXPECT_EQ(root.GetBytes(), test_roots.back().GetBytes());
}